

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O1

BendType * __thiscall
OpenMD::ForceField::getBendType(ForceField *this,string *at1,string *at2,string *at3)

{
  AtomTypeContainer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer ptVar3;
  pointer ptVar4;
  ElemPtr pBVar5;
  ElemPtr this_01;
  ElemPtr this_02;
  ElemPtr this_03;
  ulong uVar6;
  pointer ppAVar7;
  pointer ppAVar8;
  int iVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  theKeys;
  vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  foundBends;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at3Chain;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at2Chain;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at1Chain;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  myKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at3key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at2key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at1key;
  int local_160;
  int local_15c;
  string local_158;
  TypeContainer<OpenMD::BendType,_3> *local_138;
  pointer local_130;
  vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_128;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_110;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_f8;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  ForceField *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c8,at1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c8,at2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c8,at3);
  local_138 = &this->bendTypeCont_;
  pBVar5 = TypeContainer<OpenMD::BendType,_3>::find(local_138,&local_c8);
  if (pBVar5 == (ElemPtr)0x0) {
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_48,at1);
    this_00 = &this->atomTypeCont_;
    this_01 = TypeContainer<OpenMD::AtomType,_1>::find(this_00,&local_48);
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_68,at2);
    this_02 = TypeContainer<OpenMD::AtomType,_1>::find(this_00,&local_68);
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_88,at3);
    this_03 = TypeContainer<OpenMD::AtomType,_1>::find(this_00,&local_88);
    AtomType::allYourBase(&local_e0,this_01);
    AtomType::allYourBase(&local_f8,this_02);
    local_b0 = this;
    AtomType::allYourBase(&local_110,this_03);
    local_128.
    super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.
    super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.
    super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_130 = local_f8.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    if (local_f8.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl
        .super__Vector_impl_data._M_start !=
        local_f8.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      paVar1 = &local_158.field_2;
      local_15c = 0;
      do {
        if (local_e0.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_e0.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_160 = 0;
          ppAVar7 = local_e0.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            ppAVar8 = local_110.
                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            iVar9 = local_160;
            if (local_110.
                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_110.
                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              do {
                local_a8 = 0;
                uStack_a0 = 0;
                local_98 = 0;
                AtomType::getName_abi_cxx11_(&local_158,*ppAVar7);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_a8,&local_158);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != paVar1) {
                  operator_delete(local_158._M_dataplus._M_p,
                                  local_158.field_2._M_allocated_capacity + 1);
                }
                AtomType::getName_abi_cxx11_(&local_158,*local_130);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_a8,&local_158);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != paVar1) {
                  operator_delete(local_158._M_dataplus._M_p,
                                  local_158.field_2._M_allocated_capacity + 1);
                }
                AtomType::getName_abi_cxx11_(&local_158,*ppAVar8);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_a8,&local_158);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != paVar1) {
                  operator_delete(local_158._M_dataplus._M_p,
                                  local_158.field_2._M_allocated_capacity + 1);
                }
                pBVar5 = TypeContainer<OpenMD::BendType,_3>::find(local_138,(KeyType *)&local_a8);
                if (pBVar5 != (ElemPtr)0x0) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_158,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_a8);
                  local_158.field_2._12_4_ = local_15c;
                  local_158.field_2._8_4_ = iVar9;
                  std::
                  vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  ::
                  emplace_back<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                              *)&local_128,
                             (tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_158);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_158);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_a8);
                ppAVar8 = ppAVar8 + 1;
                iVar9 = iVar9 + 1;
              } while (ppAVar8 !=
                       local_110.
                       super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
            }
            local_160 = local_160 + 1;
            ppAVar7 = ppAVar7 + 1;
          } while (ppAVar7 !=
                   local_e0.
                   super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        local_15c = local_15c + 1;
        local_130 = local_130 + 1;
      } while (local_130 !=
               local_f8.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    ptVar4 = local_128.
             super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ptVar3 = local_128.
             super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_128.
        super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_128.
        super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pBVar5 = TypeContainer<OpenMD::BendType,_3>::find
                         (local_138,&local_c8,&local_b0->wildCardAtomTypeName_);
    }
    else {
      uVar6 = (long)local_128.
                    super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_128.
                    super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>*,std::vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_128.
                 super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_128.
                 super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>*,std::vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (ptVar3,ptVar4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_158,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_128.
                  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
      pBVar5 = TypeContainer<OpenMD::BendType,_3>::find(local_138,(KeyType *)&local_158);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_158);
    }
    std::
    vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~vector(&local_128);
    if (local_110.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_110.
                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_110.
                            super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.
                            super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f8.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.
                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_f8.
                            super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.
                            super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_e0.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e0.
                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_e0.
                            super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e0.
                            super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return pBVar5;
}

Assistant:

BendType* ForceField::getBendType(const std::string& at1,
                                    const std::string& at2,
                                    const std::string& at3) {
    std::vector<std::string> keys;
    keys.push_back(at1);
    keys.push_back(at2);
    keys.push_back(at3);

    // try exact match first
    BendType* bendType = bendTypeCont_.find(keys);
    if (bendType) {
      return bendType;
    } else {
      AtomType* atype1;
      AtomType* atype2;
      AtomType* atype3;
      std::vector<std::string> at1key;
      at1key.push_back(at1);
      atype1 = atomTypeCont_.find(at1key);

      std::vector<std::string> at2key;
      at2key.push_back(at2);
      atype2 = atomTypeCont_.find(at2key);

      std::vector<std::string> at3key;
      at3key.push_back(at3);
      atype3 = atomTypeCont_.find(at3key);

      // query atom types for their chains of responsibility
      std::vector<AtomType*> at1Chain = atype1->allYourBase();
      std::vector<AtomType*> at2Chain = atype2->allYourBase();
      std::vector<AtomType*> at3Chain = atype3->allYourBase();

      std::vector<AtomType*>::iterator i;
      std::vector<AtomType*>::iterator j;
      std::vector<AtomType*>::iterator k;

      int ii = 0;
      int jj = 0;
      int kk = 0;
      int IKscore;

      std::vector<std::tuple<int, int, std::vector<std::string>>> foundBends;

      for (j = at2Chain.begin(); j != at2Chain.end(); ++j) {
        ii = 0;
        for (i = at1Chain.begin(); i != at1Chain.end(); ++i) {
          kk = 0;
          for (k = at3Chain.begin(); k != at3Chain.end(); ++k) {
            IKscore = ii + kk;

            std::vector<std::string> myKeys;
            myKeys.push_back((*i)->getName());
            myKeys.push_back((*j)->getName());
            myKeys.push_back((*k)->getName());

            BendType* bendType = bendTypeCont_.find(myKeys);
            if (bendType) {
              foundBends.push_back(std::make_tuple(jj, IKscore, myKeys));
            }
            kk++;
          }
          ii++;
        }
        jj++;
      }

      if (!foundBends.empty()) {
        std::sort(foundBends.begin(), foundBends.end());
        std::vector<std::string> theKeys = std::get<2>(foundBends[0]);

        BendType* bestType = bendTypeCont_.find(theKeys);
        return bestType;
      } else {
        // if no exact match found, try wild card match
        return bendTypeCont_.find(keys, wildCardAtomTypeName_);
      }
    }
  }